

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_121;
  string local_120;
  string local_100;
  allocator local_d9;
  undefined1 local_d8 [8];
  string linkFlagsConfig;
  string local_b0;
  undefined1 local_90 [8];
  string extraFlags;
  allocator local_59;
  undefined1 local_58 [8];
  string linkRuleVar;
  string linkLanguage;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  bVar2 = cmTarget::IsFrameworkOnApple((this->super_cmMakefileTargetGenerator).Target);
  if (bVar2) {
    WriteFrameworkRules(this,relink);
  }
  else {
    cmTarget::GetLinkerLanguage
              ((string *)((long)&linkRuleVar.field_2 + 8),
               (this->super_cmMakefileTargetGenerator).Target,
               &(this->super_cmMakefileTargetGenerator).ConfigName);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_58,"CMAKE_",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    std::__cxx11::string::operator+=
              ((string *)local_58,(string *)(linkRuleVar.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_58,"_CREATE_SHARED_LIBRARY");
    std::__cxx11::string::string((string *)local_90);
    this_00 = (this->super_cmMakefileTargetGenerator).Target;
    pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b0,"LINK_FLAGS",
               (allocator *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
    pcVar3 = cmTarget::GetProperty(this_00,&local_b0);
    (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,local_90,pcVar3);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator
              ((allocator<char> *)(linkFlagsConfig.field_2._M_local_buf + 0xf));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d8,"LINK_FLAGS_",&local_d9);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    cmsys::SystemTools::UpperCase(&local_100,&(this->super_cmMakefileTargetGenerator).ConfigName);
    std::__cxx11::string::operator+=((string *)local_d8,(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar3 = cmTarget::GetProperty
                       ((this->super_cmMakefileTargetGenerator).Target,(string *)local_d8);
    (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,local_90,pcVar3);
    pcVar1 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_120,"CMAKE_SHARED_LINKER_FLAGS",&local_121);
    cmLocalGenerator::AddConfigVariableFlags
              (&pcVar1->super_cmLocalGenerator,(string *)local_90,&local_120,
               &(this->super_cmMakefileTargetGenerator).ConfigName);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator((allocator<char> *)&local_121);
    cmMakefileTargetGenerator::AddModuleDefinitionFlag
              (&this->super_cmMakefileTargetGenerator,(string *)local_90);
    WriteLibraryRules(this,(string *)local_58,(string *)local_90,relink);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)(linkRuleVar.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules(bool relink)
{
  if(this->Target->IsFrameworkOnApple())
    {
    this->WriteFrameworkRules(relink);
    return;
    }
  std::string linkLanguage =
    this->Target->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_LIBRARY";

  std::string extraFlags;
  this->LocalGenerator->AppendFlags
    (extraFlags, this->Target->GetProperty("LINK_FLAGS"));
  std::string linkFlagsConfig = "LINK_FLAGS_";
  linkFlagsConfig += cmSystemTools::UpperCase(this->ConfigName);
  this->LocalGenerator->AppendFlags
    (extraFlags, this->Target->GetProperty(linkFlagsConfig));

  this->LocalGenerator->AddConfigVariableFlags
    (extraFlags, "CMAKE_SHARED_LINKER_FLAGS", this->ConfigName);
  this->AddModuleDefinitionFlag(extraFlags);

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}